

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

size_t eckey_get_bitlen(mbedtls_pk_context_conflict *pk)

{
  mbedtls_ecp_keypair *ecp;
  mbedtls_pk_context_conflict *pk_local;
  
  return *(size_t *)((long)pk->pk_ctx + 0x78);
}

Assistant:

static size_t eckey_get_bitlen(mbedtls_pk_context *pk)
{
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    return pk->ec_bits;
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *ecp = (mbedtls_ecp_keypair *) pk->pk_ctx;
    return ecp->grp.pbits;
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */
}